

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thingdef_codeptr.cpp
# Opt level: O3

int AF_A_CheckForReload(VMFrameStack *stack,VMValue *param,int numparam,VMReturn *ret,int numret)

{
  VM_UBYTE VVar1;
  int iVar2;
  undefined8 *puVar3;
  void *val;
  PClass *pPVar4;
  PClass *pPVar5;
  int iVar6;
  char *pcVar7;
  AWeapon *this;
  undefined8 *puVar8;
  bool bVar9;
  
  pPVar4 = AActor::RegistrationInfo.MyClass;
  if (numparam < 1) {
    pcVar7 = "(paramnum) < numparam";
    goto LAB_0067b7cf;
  }
  if ((param->field_0).field_3.Type != '\x03') goto LAB_0067b7bf;
  puVar8 = (undefined8 *)(param->field_0).field_1.a;
  if ((param->field_0).field_1.atag == 1) {
    if (puVar8 == (undefined8 *)0x0) goto LAB_0067b5a2;
    pPVar5 = (PClass *)puVar8[1];
    if (pPVar5 == (PClass *)0x0) {
      pPVar5 = (PClass *)(**(code **)*puVar8)(puVar8);
      puVar8[1] = pPVar5;
    }
    bVar9 = pPVar5 != (PClass *)0x0;
    if (pPVar5 != pPVar4 && bVar9) {
      do {
        pPVar5 = pPVar5->ParentClass;
        bVar9 = pPVar5 != (PClass *)0x0;
        if (pPVar5 == pPVar4) break;
      } while (pPVar5 != (PClass *)0x0);
    }
    if (!bVar9) {
      pcVar7 = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
      goto LAB_0067b7cf;
    }
  }
  else {
    if (puVar8 != (undefined8 *)0x0) goto LAB_0067b7bf;
LAB_0067b5a2:
    puVar8 = (undefined8 *)0x0;
  }
  pPVar4 = AActor::RegistrationInfo.MyClass;
  if (numparam != 1) {
    VVar1 = param[1].field_0.field_3.Type;
    if (VVar1 != 0xff) {
      if (VVar1 != '\x03') {
LAB_0067b7bf:
        pcVar7 = 
        "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
        ;
        goto LAB_0067b7cf;
      }
      puVar3 = (undefined8 *)param[1].field_0.field_1.a;
      if (param[1].field_0.field_1.atag == 1) {
        if (puVar3 != (undefined8 *)0x0) {
          pPVar5 = (PClass *)puVar3[1];
          if (pPVar5 == (PClass *)0x0) {
            pPVar5 = (PClass *)(**(code **)*puVar3)(puVar3);
            puVar3[1] = pPVar5;
          }
          bVar9 = pPVar5 != (PClass *)0x0;
          if (pPVar5 != pPVar4 && bVar9) {
            do {
              pPVar5 = pPVar5->ParentClass;
              bVar9 = pPVar5 != (PClass *)0x0;
              if (pPVar5 == pPVar4) break;
            } while (pPVar5 != (PClass *)0x0);
          }
          if (!bVar9) {
            pcVar7 = "stateowner == NULL || stateowner->IsKindOf(RUNTIME_CLASS(AActor))";
            goto LAB_0067b7cf;
          }
        }
      }
      else if (puVar3 != (undefined8 *)0x0) goto LAB_0067b7bf;
    }
    if (((2 < numparam) && (VVar1 = param[2].field_0.field_3.Type, VVar1 != 0xff)) &&
       ((VVar1 != '\x03' ||
        ((param[2].field_0.field_1.atag != 8 && (param[2].field_0.field_1.a != (void *)0x0)))))) {
      pcVar7 = 
      "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_STATEINFO || param[paramnum].a == NULL)"
      ;
LAB_0067b7cf:
      __assert_fail(pcVar7,
                    "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/thingdef/thingdef_codeptr.cpp"
                    ,0x1206,
                    "int AF_A_CheckForReload(VMFrameStack *, VMValue *, int, VMReturn *, int)");
    }
  }
  if ((puVar8[0x40] == 0) || (this = *(AWeapon **)(puVar8[0x40] + 0xd0), this == (AWeapon *)0x0)) {
    if (numret < 1) {
      return 0;
    }
    if (ret != (VMReturn *)0x0) {
      VMReturn::SetPointer(ret,(void *)0x0,7);
      return 1;
    }
    __assert_fail("ret != NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/thingdef/thingdef_codeptr.cpp"
                  ,0x120a,"int AF_A_CheckForReload(VMFrameStack *, VMValue *, int, VMReturn *, int)"
                 );
  }
  if (numparam < 4) {
    pcVar7 = "(paramnum) < numparam";
LAB_0067b800:
    __assert_fail(pcVar7,
                  "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/thingdef/thingdef_codeptr.cpp"
                  ,0x120c,"int AF_A_CheckForReload(VMFrameStack *, VMValue *, int, VMReturn *, int)"
                 );
  }
  if (param[3].field_0.field_3.Type != '\0') {
    pcVar7 = "param[paramnum].Type == REGT_INT";
    goto LAB_0067b800;
  }
  if (numparam == 4) {
    pcVar7 = "(paramnum) < numparam";
LAB_0067b81f:
    __assert_fail(pcVar7,
                  "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/thingdef/thingdef_codeptr.cpp"
                  ,0x120d,"int AF_A_CheckForReload(VMFrameStack *, VMValue *, int, VMReturn *, int)"
                 );
  }
  if ((param[4].field_0.field_3.Type != '\x03') ||
     (val = param[4].field_0.field_1.a, val != (void *)0x0 && param[4].field_0.field_1.atag != 7)) {
    pcVar7 = 
    "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_STATE || param[paramnum].a == NULL)"
    ;
    goto LAB_0067b81f;
  }
  iVar2 = param[3].field_0.i;
  if (5 < (uint)numparam) {
    VVar1 = param[5].field_0.field_3.Type;
    if (VVar1 == '\0') {
      bVar9 = param[5].field_0.i != 0;
      goto LAB_0067b72b;
    }
    if (VVar1 != 0xff) {
      __assert_fail("param[paramnum].Type == REGT_INT",
                    "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/thingdef/thingdef_codeptr.cpp"
                    ,0x120e,
                    "int AF_A_CheckForReload(VMFrameStack *, VMValue *, int, VMReturn *, int)");
    }
  }
  bVar9 = false;
LAB_0067b72b:
  if (0 < numret) {
    VMReturn::SetPointer(ret,(void *)0x0,7);
    this = *(AWeapon **)(puVar8[0x40] + 0xd0);
    numret = 1;
  }
  iVar6 = 1;
  if (((bool)(bVar9 & this->ReloadCounter == 0)) ||
     (iVar6 = (this->ReloadCounter + 1) % iVar2, iVar6 != 0)) {
    if (numret != 0) {
      VMReturn::SetPointer(ret,val,7);
    }
  }
  else {
    iVar6 = 0;
    AWeapon::CheckAmmo(this,0,false,false,-1);
  }
  if (!bVar9) {
    this->ReloadCounter = iVar6;
  }
  return numret;
}

Assistant:

DEFINE_ACTION_FUNCTION_PARAMS(AActor, A_CheckForReload)
{
	PARAM_ACTION_PROLOGUE;

	if ( self->player == NULL || self->player->ReadyWeapon == NULL )
	{
		ACTION_RETURN_STATE(NULL);
	}
	PARAM_INT		(count);
	PARAM_STATE		(jump);
	PARAM_BOOL_OPT	(dontincrement)		{ dontincrement = false; }

	if (numret > 0)
	{
		ret->SetPointer(NULL, ATAG_STATE);
		numret = 1;
	}

	AWeapon *weapon = self->player->ReadyWeapon;

	int ReloadCounter = weapon->ReloadCounter;
	if (!dontincrement || ReloadCounter != 0)
		ReloadCounter = (weapon->ReloadCounter+1) % count;
	else // 0 % 1 = 1?  So how do we check if the weapon was never fired?  We should only do this when we're not incrementing the counter though.
		ReloadCounter = 1;

	// If we have not made our last shot...
	if (ReloadCounter != 0)
	{
		// Go back to the refire frames, instead of continuing on to the reload frames.
		if (numret != 0)
		{
			ret->SetPointer(jump, ATAG_STATE);
		}
	}
	else
	{
		// We need to reload. However, don't reload if we're out of ammo.
		weapon->CheckAmmo(false, false);
	}
	if (!dontincrement)
	{
		weapon->ReloadCounter = ReloadCounter;
	}
	return numret;
}